

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::CosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::CosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::CosOp>_>
::UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::CosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::CosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::CosOp>_>
           *this,GeneratorState *state,char *function,ConstValueRangeAccess valueRange)

{
  char *__s;
  int iVar1;
  VariableType *pVVar2;
  float *inMin;
  float *inMax;
  float outMin;
  float outMax;
  ConstValueAccess CVar3;
  ConstStridedValueAccess<1> CVar4;
  ConstStridedValueAccess<1> local_c8;
  ConstStridedValueAccess<1> local_b8;
  ConstValueAccess local_a8;
  ConstValueAccess local_98;
  ComputeUnaryBuiltinVecRange<rsg::CosOp> local_81;
  ValueRangeAccess local_80;
  undefined1 local_68 [8];
  ValueRangeAccess inRange;
  ConstValueRangeAccess outRange;
  int ndx;
  allocator<char> local_21;
  char *local_20;
  char *function_local;
  GeneratorState *state_local;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::CosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::CosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::CosOp>_>
  *this_local;
  
  local_20 = function;
  function_local = (char *)state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  __s = local_20;
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_0025b190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_function,__s,&local_21);
  std::allocator<char>::~allocator(&local_21);
  pVVar2 = ConstValueRangeAccess::getType(&valueRange);
  ValueRange::ValueRange(&this->m_inValueRange,pVVar2);
  ValueStorage<64>::ValueStorage(&this->m_value);
  this->m_child = (Expression *)0x0;
  pVVar2 = ConstValueRangeAccess::getType(&valueRange);
  ValueStorage<64>::setStorage(&this->m_value,pVVar2);
  outRange.m_max._0_4_ = 0;
  while( true ) {
    pVVar2 = ValueRange::getType(&this->m_inValueRange);
    iVar1 = VariableType::getNumElements(pVVar2);
    if (iVar1 <= (int)outRange.m_max) break;
    ConstValueRangeAccess::component
              ((ConstValueRangeAccess *)&inRange.super_ConstValueRangeAccess.m_max,&valueRange,
               (int)outRange.m_max);
    ValueRange::asAccess(&local_80,&this->m_inValueRange);
    ValueRangeAccess::component((ValueRangeAccess *)local_68,&local_80,(int)outRange.m_max);
    CVar3 = ConstValueRangeAccess::getMin
                      ((ConstValueRangeAccess *)&inRange.super_ConstValueRangeAccess.m_max);
    local_98 = CVar3;
    outMin = ConstStridedValueAccess<1>::asFloat(&local_98);
    CVar3 = ConstValueRangeAccess::getMax
                      ((ConstValueRangeAccess *)&inRange.super_ConstValueRangeAccess.m_max);
    local_a8 = CVar3;
    outMax = ConstStridedValueAccess<1>::asFloat(&local_a8);
    CVar4 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_68);
    local_b8 = CVar4;
    inMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_b8);
    CVar4 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_68);
    local_c8 = CVar4;
    inMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_c8);
    ComputeUnaryBuiltinVecRange<rsg::CosOp>::operator()(&local_81,outMin,outMax,inMin,inMax);
    outRange.m_max._0_4_ = (int)outRange.m_max + 1;
  }
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::UnaryBuiltinVecFunc (GeneratorState& state, const char* function, ConstValueRangeAccess valueRange)
	: m_function		(function)
	, m_inValueRange	(valueRange.getType())
	, m_child			(DE_NULL)
{
	DE_UNREF(state);
	DE_ASSERT(valueRange.getType().isFloatOrVec());

	m_value.setStorage(valueRange.getType());

	// Compute input value range
	for (int ndx = 0; ndx < m_inValueRange.getType().getNumElements(); ndx++)
	{
		ConstValueRangeAccess	outRange	= valueRange.component(ndx);
		ValueRangeAccess		inRange		= m_inValueRange.asAccess().component(ndx);

		ComputeValueRange()(outRange.getMin().asFloat(), outRange.getMax().asFloat(), inRange.getMin().asFloat(), inRange.getMax().asFloat());
	}
}